

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

bool __thiscall Assimp::Importer::ValidateFlags(Importer *this,uint pFlags)

{
  pointer ppBVar1;
  BaseProcess *pBVar2;
  bool bVar3;
  int iVar4;
  uint mask;
  uint uVar5;
  ulong uVar6;
  
  bVar3 = _ValidateFlags(pFlags);
  if (bVar3) {
    for (uVar5 = 1; -1 < (int)uVar5; uVar5 = uVar5 * 2) {
      if ((pFlags & 0x7ffffbff & uVar5) != 0) {
        uVar6 = 0;
        do {
          ppBVar1 = (this->pimpl->mPostProcessingSteps).
                    super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->pimpl->mPostProcessingSteps).
                            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <=
              uVar6) goto LAB_0030debb;
          pBVar2 = ppBVar1[uVar6];
          iVar4 = (*pBVar2->_vptr_BaseProcess[2])(pBVar2,(ulong)uVar5);
          uVar6 = (ulong)((int)uVar6 + 1);
        } while ((char)iVar4 == '\0');
      }
    }
    bVar3 = true;
  }
  else {
LAB_0030debb:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Importer::ValidateFlags(unsigned int pFlags) const {
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // run basic checks for mutually exclusive flags
    if(!_ValidateFlags(pFlags)) {
        return false;
    }

    // ValidateDS does not anymore occur in the pp list, it plays an awesome extra role ...
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    if (pFlags & aiProcess_ValidateDataStructure) {
        return false;
    }
#endif
    pFlags &= ~aiProcess_ValidateDataStructure;

    // Now iterate through all bits which are set in the flags and check whether we find at least
    // one pp plugin which handles it.
    for (unsigned int mask = 1; mask < (1u << (sizeof(unsigned int)*8-1));mask <<= 1) {

        if (pFlags & mask) {

            bool have = false;
            for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)   {
                if (pimpl->mPostProcessingSteps[a]-> IsActive(mask) ) {

                    have = true;
                    break;
                }
            }
            if (!have) {
                return false;
            }
        }
    }
    ASSIMP_END_EXCEPTION_REGION(bool);
    return true;
}